

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O0

UnicodeSet * __thiscall icu_63::UnicodeSet::complement(UnicodeSet *this)

{
  UBool UVar1;
  UErrorCode local_1c;
  UnicodeSet *pUStack_18;
  UErrorCode status;
  UnicodeSet *this_local;
  
  pUStack_18 = this;
  UVar1 = isFrozen(this);
  if ((UVar1 == '\0') && (UVar1 = isBogus(this), UVar1 == '\0')) {
    local_1c = U_ZERO_ERROR;
    if (*this->list == 0) {
      ensureBufferCapacity(this,this->len + -1,&local_1c);
      UVar1 = ::U_FAILURE(local_1c);
      if (UVar1 != '\0') {
        return this;
      }
      memcpy(this->buffer,this->list + 1,(long)(this->len + -1) << 2);
      this->len = this->len + -1;
    }
    else {
      ensureBufferCapacity(this,this->len + 1,&local_1c);
      UVar1 = ::U_FAILURE(local_1c);
      if (UVar1 != '\0') {
        return this;
      }
      memcpy(this->buffer + 1,this->list,(long)this->len << 2);
      *this->buffer = 0;
      this->len = this->len + 1;
    }
    swapBuffers(this);
    releasePattern(this);
  }
  return this;
}

Assistant:

UnicodeSet& UnicodeSet::complement(void) {
    if (isFrozen() || isBogus()) {
        return *this;
    }
    UErrorCode status = U_ZERO_ERROR;
    if (list[0] == UNICODESET_LOW) {
        ensureBufferCapacity(len-1, status);
        if (U_FAILURE(status)) {
            return *this;
        }
        uprv_memcpy(buffer, list + 1, (size_t)(len-1)*sizeof(UChar32));
        --len;
    } else {
        ensureBufferCapacity(len+1, status);
        if (U_FAILURE(status)) {
            return *this;
        }
        uprv_memcpy(buffer + 1, list, (size_t)len*sizeof(UChar32));
        buffer[0] = UNICODESET_LOW;
        ++len;
    }
    swapBuffers();
    releasePattern();
    return *this;
}